

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::PrintRelocation
          (BinaryReaderObjdumpBase *this,Reloc *reloc,Offset offset)

{
  char *pcVar1;
  size_type sVar2;
  const_pointer pvVar3;
  string_view local_40;
  string_view local_30;
  Offset local_20;
  Offset offset_local;
  Reloc *reloc_local;
  BinaryReaderObjdumpBase *this_local;
  
  local_20 = offset;
  offset_local = (Offset)reloc;
  reloc_local = (Reloc *)this;
  pcVar1 = GetRelocTypeName(reloc->type);
  printf("           %06zx: %-18s %u",offset,pcVar1,(ulong)*(uint *)(offset_local + 0x10));
  if (*(int *)(offset_local + 0x14) != 0) {
    printf(" + %d",(ulong)*(uint *)(offset_local + 0x14));
  }
  if (*(int *)offset_local != 6) {
    local_30 = GetSymbolName(this,*(Index *)(offset_local + 0x10));
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
    local_40 = GetSymbolName(this,*(Index *)(offset_local + 0x10));
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_40);
    printf(" <%.*s>",sVar2 & 0xffffffff,pvVar3);
  }
  printf("\n");
  return;
}

Assistant:

void BinaryReaderObjdumpBase::PrintRelocation(const Reloc& reloc,
                                              Offset offset) const {
  printf("           %06" PRIzx ": %-18s %" PRIindex, offset,
         GetRelocTypeName(reloc.type), reloc.index);
  if (reloc.addend) {
    printf(" + %d", reloc.addend);
  }
  if (reloc.type != RelocType::TypeIndexLEB) {
    printf(" <" PRIstringview ">",
           WABT_PRINTF_STRING_VIEW_ARG(GetSymbolName(reloc.index)));
  }
  printf("\n");
}